

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_test.cpp
# Opt level: O0

XrResult LayerTestXrCreateApiLayerInstance
                   (XrInstanceCreateInfo *info,XrApiLayerCreateInfo *apiLayerInfo,
                   XrInstance *instance)

{
  mapped_type p_Var1;
  mapped_type *pp_Var2;
  undefined1 local_248 [4];
  XrResult res;
  XrApiLayerCreateInfo newApiLayerInfo;
  XrInstance *instance_local;
  XrApiLayerCreateInfo *apiLayerInfo_local;
  XrInstanceCreateInfo *info_local;
  
  newApiLayerInfo.nextInfo = (XrApiLayerNextInfo *)instance;
  memcpy(local_248,apiLayerInfo,0x220);
  newApiLayerInfo.settings_file_location._504_8_ = apiLayerInfo->nextInfo->next;
  info_local._4_4_ =
       (*apiLayerInfo->nextInfo->nextCreateApiLayerInstance)
                 (info,(XrApiLayerCreateInfo *)local_248,(XrInstance *)newApiLayerInfo.nextInfo);
  if (XR_ERROR_VALIDATION_FAILURE < info_local._4_4_) {
    p_Var1 = (mapped_type)apiLayerInfo->nextInfo->nextGetInstanceProcAddr;
    pp_Var2 = std::
              map<XrInstance_T_*,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)()),_std::less<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>_>
              ::operator[](&g_next_gipa_map,(key_type *)newApiLayerInfo.nextInfo);
    *pp_Var2 = p_Var1;
    info_local._4_4_ = XR_SUCCESS;
  }
  return info_local._4_4_;
}

Assistant:

static XRAPI_ATTR XrResult XRAPI_CALL LayerTestXrCreateApiLayerInstance(const XrInstanceCreateInfo *info,
                                                                        const XrApiLayerCreateInfo *apiLayerInfo,
                                                                        XrInstance *instance) {
    // Call down to the next layer's xrCreateApiLayerInstance.
    // Clone the XrApiLayerCreateInfo, but move to the next XrApiLayerNextInfo in the chain. nextInfo will be null
    // if the loader's terminator function is going to be called (between the layer and the runtime) but this is OK
    // because the loader's terminator function won't use it.
    XrApiLayerCreateInfo newApiLayerInfo = *apiLayerInfo;
    newApiLayerInfo.nextInfo = apiLayerInfo->nextInfo->next;

    const XrResult res = apiLayerInfo->nextInfo->nextCreateApiLayerInstance(info, &newApiLayerInfo, instance);
    if (XR_FAILED(res)) {
        return res;  // The next layer's xrCreateApiLayerInstance failed.
    }

    g_next_gipa_map[*instance] = apiLayerInfo->nextInfo->nextGetInstanceProcAddr;

    return XR_SUCCESS;
}